

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O1

tm * h2o_filecache_get_last_modified(h2o_filecache_ref_t *ref,char *outbuf)

{
  anon_struct_88_2_79ca0e33_for__last_modified *__tp;
  char *buf;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (ref->fd != -1) {
    __tp = &(ref->field_3).field_0._last_modified;
    buf = (char *)((long)&ref->field_3 + 200);
    if (*(char *)((long)&ref->field_3 + 200) == '\0') {
      gmtime_r((time_t *)((long)&ref->field_3 + 0x58),(tm *)__tp);
      h2o_time2str_rfc1123(buf,&__tp->gm);
    }
    if (outbuf != (char *)0x0) {
      uVar1 = *(undefined8 *)buf;
      uVar2 = *(undefined8 *)((long)&ref->field_3 + 0xd0);
      uVar3 = *(undefined8 *)((long)&ref->field_3 + 0xde);
      *(undefined8 *)(outbuf + 0xe) = *(undefined8 *)((long)&ref->field_3 + 0xd6);
      *(undefined8 *)(outbuf + 0x16) = uVar3;
      *(undefined8 *)outbuf = uVar1;
      *(undefined8 *)(outbuf + 8) = uVar2;
    }
    return &__tp->gm;
  }
  __assert_fail("ref->fd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                ,0x99,"struct tm *h2o_filecache_get_last_modified(h2o_filecache_ref_t *, char *)");
}

Assistant:

struct tm *h2o_filecache_get_last_modified(h2o_filecache_ref_t *ref, char *outbuf)
{
    assert(ref->fd != -1);
    if (ref->_last_modified.str[0] == '\0') {
        gmtime_r(&ref->st.st_mtime, &ref->_last_modified.gm);
        h2o_time2str_rfc1123(ref->_last_modified.str, &ref->_last_modified.gm);
    }
    if (outbuf != NULL)
        memcpy(outbuf, ref->_last_modified.str, H2O_TIMESTR_RFC1123_LEN + 1);
    return &ref->_last_modified.gm;
}